

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O0

int __thiscall Ym_Emu<Ym2612_Emu>::run_until(Ym_Emu<Ym2612_Emu> *this,int time)

{
  Ym2612_Emu *this_00;
  int iVar1;
  int in_ESI;
  long in_RDI;
  short *p;
  int count;
  
  iVar1 = in_ESI - *(int *)(in_RDI + 8);
  if (0 < iVar1) {
    if (*(int *)(in_RDI + 8) < 0) {
      return 0;
    }
    *(int *)(in_RDI + 8) = in_ESI;
    this_00 = *(Ym2612_Emu **)(in_RDI + 0x10);
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + (long)(iVar1 * 2) * 2;
    Ym2612_Emu::run(this_00,(int)((ulong)in_RDI >> 0x20),(sample_t_conflict1 *)0x80d205);
  }
  return 1;
}

Assistant:

inline int Ym_Emu<Emu>::run_until( int time )
{
	int count = time - last_time;
	if ( count > 0 )
	{
		if ( last_time < 0 )
			return false;
		last_time = time;
		short* p = out;
		out += count * Emu::out_chan_count;
		Emu::run( count, p );
	}
	return true;
}